

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNodeTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::DDLNodeTest_hasPropertyTest_Test::DDLNodeTest_hasPropertyTest_Test
          (DDLNodeTest_hasPropertyTest_Test *this)

{
  DDLNodeTest_hasPropertyTest_Test *this_local;
  
  DDLNodeTest::DDLNodeTest(&this->super_DDLNodeTest);
  (this->super_DDLNodeTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DDLNodeTest_hasPropertyTest_Test_001e1008;
  return;
}

Assistant:

TEST_F(DDLNodeTest, hasPropertyTest) {
    DDLNode *node = DDLNode::create("test", "testName");
    ASSERT_FALSE(nullptr == node);
    bool found(false);
    found = node->hasProperty("test");
    EXPECT_FALSE(found);

    Text *id = new Text("test", 4);
    Property *first = new Property(id);
    node->setProperties(first);
    found = node->hasProperty("test");
    EXPECT_TRUE(found);
    delete node;
}